

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

void enet_host_bandwidth_throttle(ENetHost *host)

{
  enet_uint32 eVar1;
  uint uVar2;
  ENetPeer *pEVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ENetPeer *pEVar11;
  uint uVar12;
  bool bVar13;
  ENetProtocol local_60;
  
  eVar1 = enet_time_get();
  uVar9 = eVar1 - host->bandwidthThrottleEpoch;
  bVar13 = host->bandwidthLimitedPeers != 0;
  if (999 < uVar9) {
    uVar8 = (uint)host->connectedPeers;
    host->bandwidthThrottleEpoch = eVar1;
    if (uVar8 != 0) {
      if (host->outgoingBandwidth == 0) {
        uVar10 = 0xffffffffffffffff;
        uVar5 = uVar10;
      }
      else {
        pEVar3 = host->peers;
        pEVar11 = pEVar3 + host->peerCount;
        uVar10 = 0;
        for (; pEVar3 < pEVar11; pEVar3 = pEVar3 + 1) {
          if (pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) {
            uVar10 = (ulong)((int)uVar10 + pEVar3->outgoingDataTotal);
          }
        }
        uVar5 = (ulong)(host->outgoingBandwidth * uVar9) / 1000;
      }
      uVar5 = uVar5 & 0xffffffff;
      uVar12 = uVar8;
      while( true ) {
        uVar4 = (uint)uVar5;
        if ((uVar12 == 0) || (!bVar13)) break;
        iVar6 = 0x20;
        if (uVar4 < (uint)uVar10) {
          iVar6 = (int)((ulong)(uVar4 << 5) / (uVar10 & 0xffffffff));
        }
        pEVar3 = host->peers;
        pEVar11 = pEVar3 + host->peerCount;
        bVar13 = false;
        for (; pEVar3 < pEVar11; pEVar3 = pEVar3 + 1) {
          if (((pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) && (pEVar3->incomingBandwidth != 0))
             && (pEVar3->outgoingBandwidthThrottleEpoch != eVar1)) {
            uVar7 = (pEVar3->incomingBandwidth * uVar9) / 1000;
            uVar4 = pEVar3->outgoingDataTotal;
            if (uVar7 < uVar4 * iVar6 >> 5) {
              uVar2 = (uVar7 * 0x20) / uVar4;
              if (uVar7 * 0x20 < uVar4) {
                uVar2 = 1;
              }
              pEVar3->packetThrottleLimit = uVar2;
              if (uVar2 < pEVar3->packetThrottle) {
                pEVar3->packetThrottle = uVar2;
              }
              pEVar3->outgoingBandwidthThrottleEpoch = eVar1;
              pEVar3->incomingDataTotal = 0;
              pEVar3->outgoingDataTotal = 0;
              uVar12 = uVar12 - 1;
              uVar5 = (ulong)((int)uVar5 - uVar7);
              uVar10 = (ulong)((int)uVar10 - uVar7);
              bVar13 = true;
            }
          }
        }
      }
      if (uVar12 != 0) {
        if (uVar4 < (uint)uVar10) {
          uVar9 = (uint)((ulong)(uVar4 << 5) / (uVar10 & 0xffffffff));
        }
        else {
          uVar9 = 0x20;
        }
        pEVar3 = host->peers;
        pEVar11 = pEVar3 + host->peerCount;
        for (; pEVar3 < pEVar11; pEVar3 = pEVar3 + 1) {
          if ((pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) &&
             (pEVar3->outgoingBandwidthThrottleEpoch != eVar1)) {
            pEVar3->packetThrottleLimit = uVar9;
            if (uVar9 < pEVar3->packetThrottle) {
              pEVar3->packetThrottle = uVar9;
            }
            pEVar3->incomingDataTotal = 0;
            pEVar3->outgoingDataTotal = 0;
          }
        }
      }
      if (host->recalculateBandwidthLimits != 0) {
        host->recalculateBandwidthLimits = 0;
        uVar9 = host->incomingBandwidth;
        if (uVar9 == 0) {
          uVar12 = 0;
        }
        else {
          uVar10 = 0;
          bVar13 = true;
          while ((uVar12 = (uint)uVar10, uVar8 != 0 && (bVar13))) {
            bVar13 = false;
            uVar10 = (ulong)uVar9 / (ulong)uVar8;
            pEVar3 = host->peers;
            pEVar11 = pEVar3 + host->peerCount;
            for (; pEVar3 < pEVar11; pEVar3 = pEVar3 + 1) {
              if (((pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) &&
                  (pEVar3->incomingBandwidthThrottleEpoch != eVar1)) &&
                 ((uVar12 = pEVar3->outgoingBandwidth, uVar12 == 0 || (uVar12 < (uint)uVar10)))) {
                pEVar3->incomingBandwidthThrottleEpoch = eVar1;
                uVar8 = uVar8 - 1;
                uVar9 = uVar9 - uVar12;
                bVar13 = true;
              }
            }
          }
        }
        pEVar3 = host->peers;
        for (pEVar11 = pEVar3; pEVar11 < pEVar3 + host->peerCount; pEVar11 = pEVar11 + 1) {
          if (pEVar11->state - ENET_PEER_STATE_CONNECTED < 2) {
            local_60._0_2_ = 0xff8a;
            uVar9 = host->outgoingBandwidth;
            local_60.connect.mtu =
                 uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
            local_60.disconnect.data =
                 uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
            ;
            if (pEVar11->incomingBandwidthThrottleEpoch == eVar1) {
              uVar9 = pEVar11->outgoingBandwidth;
              local_60.disconnect.data =
                   uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
            }
            enet_peer_queue_outgoing_command(pEVar11,&local_60,(ENetPacket *)0x0,0,0);
            pEVar3 = host->peers;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
enet_host_bandwidth_throttle (ENetHost * host)
{
    enet_uint32 timeCurrent = enet_time_get (),
           elapsedTime = timeCurrent - host -> bandwidthThrottleEpoch,
           peersRemaining = (enet_uint32) host -> connectedPeers,
           dataTotal = ~0,
           bandwidth = ~0,
           throttle = 0,
           bandwidthLimit = 0;
    int needsAdjustment = host -> bandwidthLimitedPeers > 0 ? 1 : 0;
    ENetPeer * peer;
    ENetProtocol command;

    if (elapsedTime < ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
      return;

    host -> bandwidthThrottleEpoch = timeCurrent;

    if (peersRemaining == 0)
      return;

    if (host -> outgoingBandwidth != 0)
    {
        dataTotal = 0;
        bandwidth = (host -> outgoingBandwidth * elapsedTime) / 1000;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
            ++ peer)
        {
            if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
              continue;

            dataTotal += peer -> outgoingDataTotal;
        }
    }

    while (peersRemaining > 0 && needsAdjustment != 0)
    {
        needsAdjustment = 0;
        
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
             ++ peer)
        {
            enet_uint32 peerBandwidth;
            
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> incomingBandwidth == 0 ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peerBandwidth = (peer -> incomingBandwidth * elapsedTime) / 1000;
            if ((throttle * peer -> outgoingDataTotal) / ENET_PEER_PACKET_THROTTLE_SCALE <= peerBandwidth)
              continue;

            peer -> packetThrottleLimit = (peerBandwidth * 
                                            ENET_PEER_PACKET_THROTTLE_SCALE) / peer -> outgoingDataTotal;
            
            if (peer -> packetThrottleLimit == 0)
              peer -> packetThrottleLimit = 1;
            
            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> outgoingBandwidthThrottleEpoch = timeCurrent;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;

            needsAdjustment = 1;
            -- peersRemaining;
            bandwidth -= peerBandwidth;
            dataTotal -= peerBandwidth;
        }
    }

    if (peersRemaining > 0)
    {
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
             ++ peer)
        {
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peer -> packetThrottleLimit = throttle;

            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;
        }
    }

    if (host -> recalculateBandwidthLimits)
    {
       host -> recalculateBandwidthLimits = 0;

       peersRemaining = (enet_uint32) host -> connectedPeers;
       bandwidth = host -> incomingBandwidth;
       needsAdjustment = 1;

       if (bandwidth == 0)
         bandwidthLimit = 0;
       else
       while (peersRemaining > 0 && needsAdjustment != 0)
       {
           needsAdjustment = 0;
           bandwidthLimit = bandwidth / peersRemaining;

           for (peer = host -> peers;
                peer < & host -> peers [host -> peerCount];
                ++ peer)
           {
               if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                   peer -> incomingBandwidthThrottleEpoch == timeCurrent)
                 continue;

               if (peer -> outgoingBandwidth > 0 &&
                   peer -> outgoingBandwidth >= bandwidthLimit)
                 continue;

               peer -> incomingBandwidthThrottleEpoch = timeCurrent;
 
               needsAdjustment = 1;
               -- peersRemaining;
               bandwidth -= peer -> outgoingBandwidth;
           }
       }

       for (peer = host -> peers;
            peer < & host -> peers [host -> peerCount];
            ++ peer)
       {
           if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
             continue;

           command.header.command = ENET_PROTOCOL_COMMAND_BANDWIDTH_LIMIT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
           command.header.channelID = 0xFF;
           command.bandwidthLimit.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);

           if (peer -> incomingBandwidthThrottleEpoch == timeCurrent)
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (peer -> outgoingBandwidth);
           else
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (bandwidthLimit);

           enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
       } 
    }
}